

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O2

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint maxval;
  ostream *poVar1;
  undefined8 *puVar2;
  int i;
  int iVar3;
  CharacterHash<unsigned_int,_unsigned_char> ch;
  
  this->n = myn;
  this->wordsize = mywordsize;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_Deque_base
            (&(this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,0);
  if ((uint)this->wordsize < 0x21) {
    for (iVar3 = 0; iVar3 < this->n; iVar3 = iVar3 + 1) {
      maxval = maskfnc<unsigned_int>(this->wordsize);
      CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&ch,maxval);
      std::
      vector<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
      ::push_back(&this->hashers,&ch);
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Can\'t create ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->wordsize);
  poVar1 = std::operator<<(poVar1,"-bit hash values");
  std::endl<char,std::char_traits<char>>(poVar1);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "abord";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

ThreeWiseHash(int myn, int mywordsize = 19)
      : n(myn), wordsize(mywordsize), hashers(), hasher(0) {
    if (static_cast<uint>(wordsize) > 8 * sizeof(hashvaluetype)) {
      cerr << "Can't create " << wordsize << "-bit hash values" << endl;
      throw "abord";
    }
    for (int i = 0; i < n; ++i) {
      CharacterHash<hashvaluetype, chartype> ch(
          maskfnc<hashvaluetype>(wordsize));
      hashers.push_back(ch);
    }
  }